

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_parse_tests.cpp
# Opt level: O2

void __thiscall script_parse_tests::parse_script::test_method(parse_script *this)

{
  undefined8 uVar1;
  uint uVar2;
  long lVar3;
  iterator in_R8;
  iterator pvVar4;
  string *in_R9;
  string *psVar5;
  iterator pvVar6;
  pointer s;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  const_string file;
  Span<const_unsigned_char> s_00;
  const_string file_00;
  Span<const_unsigned_char> s_01;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  string *psVar7;
  char *local_900;
  char *local_8f8;
  undefined1 *local_8f0;
  undefined1 *local_8e8;
  char *local_8e0;
  char *local_8d8;
  undefined1 *local_8d0;
  undefined1 *local_8c8;
  char *local_8c0;
  char *local_8b8;
  char *local_880;
  char *local_878;
  undefined1 *local_870;
  undefined1 *local_868;
  char *local_860;
  char *local_858;
  undefined1 *local_850;
  undefined1 *local_848;
  char *local_840;
  char *local_838;
  char *local_7e0;
  char *local_7d8;
  undefined1 *local_7d0;
  undefined1 *local_7c8;
  char *local_7c0;
  char *local_7b8;
  undefined1 *local_7b0;
  undefined1 *local_7a8;
  char *local_7a0;
  char *local_798;
  char *local_790;
  char *local_788;
  undefined1 *local_780;
  undefined1 *local_778;
  char *local_770;
  char *local_768;
  char *local_760;
  char *local_758;
  undefined1 *local_750;
  undefined1 *local_748;
  char *local_740;
  char *local_738;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  IN_OUT;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_718;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_6f8;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_6d8;
  direct_or_indirect local_6b8;
  uint local_69c;
  string local_698;
  undefined1 local_678 [16];
  undefined1 *local_668;
  char *local_660;
  string all_out;
  string all_in;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5f8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_578;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_538;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4f8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_478;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_438;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_378;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_338;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_278;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_238;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[1],_const_char_(&)[1],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&all_in,(char (*) [1])0xc694e1,(char (*) [1])0xc694e1);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
            (&local_5f8,(char (*) [2])0xcbbcad,(char (*) [3])0xb6abf8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
            (&local_5b8,(char (*) [2])0xc69f21,(char (*) [3])0xb9c58c);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
            (&local_578,(char (*) [2])0xb6523c,(char (*) [3])0xbb2eda);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
            (&local_538,(char (*) [2])0xb5ed52,(char (*) [3])0xc3c037);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
            (&local_4f8,(char (*) [2])0xbb65b8,(char (*) [3])0xbb2eaa);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
            (&local_4b8,(char (*) [2])0xb9d78f,(char (*) [3])0xb5aba0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
            (&local_478,(char (*) [2])0xe0fa0b,(char (*) [3])0xc85dae);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
            (&local_438,(char (*) [2])0xe2308b,(char (*) [3])0xb6b73c);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
            (&local_3f8,(char (*) [2])0xb53141,(char (*) [3])0xb6cd53);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
            (&local_3b8,(char (*) [2])0xb6aa8b,(char (*) [3])0xb501f8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
            (&local_378,(char (*) [3])0xb94e0a,(char (*) [3])0xc058ce);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
            (&local_338,(char (*) [3])0xb9b1ca,(char (*) [3])0xb6c349);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
            (&local_2f8,(char (*) [3])0xc6cb9e,(char (*) [3])0xb8f5d7);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
            (&local_2b8,(char (*) [3])0xbb31ea,(char (*) [3])"5d");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
            (&local_278,(char (*) [3])0xbb31be,(char (*) [3])"5e");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
            (&local_238,(char (*) [3])0xbb3192,(char (*) [3])0xb82511);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
            (&local_1f8,(char (*) [3])0xc3f099,(char (*) [3])0xe1109f);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[5],_true>
            (&local_1b8,(char (*) [3])0xbb313a,(char (*) [5])"0111");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[5],_true>
            (&local_178,(char (*) [3])0xbbe040,(char (*) [5])"0189");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[3],_true>
            (&local_138,(char (*) [5])"0x17",(char (*) [3])0xbb313a);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[7],_true>
            (&local_f8,(char (*) [5])"\'17\'",(char (*) [7])"023137");
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[3],_true>
            (&local_b8,(char (*) [5])0xc87753,(char (*) [3])0xb70bf8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[3],_true>
            (&local_78,(char (*) [6])0xc87a6d,(char (*) [3])0xb5e085);
  __l._M_len = 0x18;
  __l._M_array = (iterator)&all_in;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&IN_OUT,__l,(allocator_type *)&all_out);
  lVar3 = 0x5c0;
  do {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&all_in._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0x40;
  } while (lVar3 != -0x40);
  all_in._M_dataplus._M_p = (pointer)&all_in.field_2;
  all_in._M_string_length = 0;
  all_out._M_dataplus._M_p = (pointer)&all_out.field_2;
  all_out._M_string_length = 0;
  all_in.field_2._M_local_buf[0] = '\0';
  all_out.field_2._M_local_buf[0] = '\0';
  for (s = IN_OUT.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      s != IN_OUT.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish; s = s + 1) {
    local_740 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_parse_tests.cpp"
    ;
    local_738 = "";
    local_750 = &boost::unit_test::basic_cstring<char_const>::null;
    local_748 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = (iterator)in_R9;
    msg.m_begin = in_R8;
    file.m_end = (iterator)0x2d;
    file.m_begin = (iterator)&local_740;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_750,msg);
    local_678[8] = false;
    local_678._0_8_ = &PTR__lazy_ostream_01139f30;
    local_668 = boost::unit_test::lazy_ostream::inst;
    local_660 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
    local_760 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_parse_tests.cpp"
    ;
    local_758 = "";
    ParseScript((CScript *)&local_6b8.indirect_contents,&s->first);
    uVar2 = local_69c - 0x1d;
    uVar1 = local_6b8.indirect_contents.indirect;
    if (local_69c < 0x1d) {
      uVar2 = local_69c;
      uVar1 = &local_6b8;
    }
    s_00.m_size._0_4_ = uVar2;
    s_00.m_data = (uchar *)uVar1;
    s_00.m_size._4_4_ = 0;
    HexStr_abi_cxx11_(&local_698,s_00);
    in_R8 = (iterator)0x2;
    in_R9 = &local_698;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_678,
               &local_760,0x2d,1,2,&local_698,"HexStr(ParseScript(in))",&s->second,"out");
    std::__cxx11::string::~string((string *)&local_698);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_6b8.indirect_contents);
    std::operator+(&local_698," ",&s->first);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_678,
                   &local_698," ");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&all_in,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_678);
    std::__cxx11::string::~string((string *)local_678);
    std::__cxx11::string::~string((string *)&local_698);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&all_out,&s->second);
  }
  local_770 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_parse_tests.cpp"
  ;
  local_768 = "";
  local_780 = &boost::unit_test::basic_cstring<char_const>::null;
  local_778 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)in_R9;
  msg_00.m_begin = in_R8;
  file_00.m_end = (iterator)0x31;
  file_00.m_begin = (iterator)&local_770;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_780,
             msg_00);
  local_678[8] = false;
  local_678._0_8_ = &PTR__lazy_ostream_01139f30;
  local_668 = boost::unit_test::lazy_ostream::inst;
  local_660 = (char *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_790 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_parse_tests.cpp"
  ;
  local_788 = "";
  ParseScript((CScript *)&local_6b8.indirect_contents,&all_in);
  uVar2 = local_69c - 0x1d;
  if (local_69c < 0x1d) {
    uVar2 = local_69c;
    local_6b8.indirect_contents.indirect = (char *)&local_6b8;
  }
  s_01.m_size._0_4_ = uVar2;
  s_01.m_data = (uchar *)local_6b8.indirect_contents.indirect;
  s_01.m_size._4_4_ = 0;
  HexStr_abi_cxx11_(&local_698,s_01);
  psVar7 = &all_out;
  pvVar4 = (iterator)0x2;
  psVar5 = &local_698;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (local_678,&local_790,0x31,1,2,psVar5,"HexStr(ParseScript(all_in))",psVar7,"all_out");
  std::__cxx11::string::~string((string *)&local_698);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_6b8.indirect_contents);
  local_7a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_parse_tests.cpp"
  ;
  local_798 = "";
  local_7b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)psVar5;
  msg_01.m_begin = pvVar4;
  file_01.m_end = (iterator)0x33;
  file_01.m_begin = (iterator)&local_7a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_7b0,
             msg_01);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_678,"11111111111111111111",(allocator<char> *)&local_698);
  ParseScript((CScript *)&local_6d8,(string *)local_678);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_6d8);
  std::__cxx11::string::~string((string *)local_678);
  local_7c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_parse_tests.cpp"
  ;
  local_7b8 = "";
  local_7d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)psVar5;
  msg_02.m_begin = pvVar4;
  file_02.m_end = (iterator)0x33;
  file_02.m_begin = (iterator)&local_7c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_7d0,
             msg_02);
  local_698._M_dataplus._M_p._0_1_ = 0;
  local_698._M_string_length = 0;
  local_698.field_2._M_allocated_capacity = 0;
  local_678[8] = false;
  local_678._0_8_ = &PTR__lazy_ostream_0113a848;
  local_668 = boost::unit_test::lazy_ostream::inst;
  local_660 = "exception std::runtime_error expected but not raised";
  local_7e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_parse_tests.cpp"
  ;
  local_7d8 = "";
  pvVar4 = &DAT_00000001;
  pvVar6 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_698,(lazy_ostream *)local_678,1,1,WARN,(check_type)psVar7,
             (size_t)&local_7e0,0x33);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_698.field_2._M_allocated_capacity);
  local_840 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_parse_tests.cpp"
  ;
  local_838 = "";
  local_850 = &boost::unit_test::basic_cstring<char_const>::null;
  local_848 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar6;
  msg_03.m_begin = pvVar4;
  file_03.m_end = (iterator)0x34;
  file_03.m_begin = (iterator)&local_840;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_850,
             msg_03);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_678,"11111111111",(allocator<char> *)&local_698);
  ParseScript((CScript *)&local_6f8,(string *)local_678);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_6f8);
  std::__cxx11::string::~string((string *)local_678);
  local_860 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_parse_tests.cpp"
  ;
  local_858 = "";
  local_870 = &boost::unit_test::basic_cstring<char_const>::null;
  local_868 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar6;
  msg_04.m_begin = pvVar4;
  file_04.m_end = (iterator)0x34;
  file_04.m_begin = (iterator)&local_860;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_870,
             msg_04);
  local_698._M_dataplus._M_p._0_1_ = 0;
  local_698._M_string_length = 0;
  local_698.field_2._M_allocated_capacity = 0;
  local_678[8] = false;
  local_678._0_8_ = &PTR__lazy_ostream_0113a848;
  local_668 = boost::unit_test::lazy_ostream::inst;
  local_660 = "exception std::runtime_error expected but not raised";
  local_880 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_parse_tests.cpp"
  ;
  local_878 = "";
  pvVar4 = &DAT_00000001;
  pvVar6 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_698,(lazy_ostream *)local_678,1,1,WARN,(check_type)psVar7,
             (size_t)&local_880,0x34);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_698.field_2._M_allocated_capacity);
  local_8c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_parse_tests.cpp"
  ;
  local_8b8 = "";
  local_8d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar6;
  msg_05.m_begin = pvVar4;
  file_05.m_end = (iterator)0x35;
  file_05.m_begin = (iterator)&local_8c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_8d0,
             msg_05);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_678,"OP_CHECKSIGADD",(allocator<char> *)&local_698);
  ParseScript((CScript *)&local_718,(string *)local_678);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_718);
  std::__cxx11::string::~string((string *)local_678);
  local_8e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_parse_tests.cpp"
  ;
  local_8d8 = "";
  local_8f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar6;
  msg_06.m_begin = pvVar4;
  file_06.m_end = (iterator)0x35;
  file_06.m_begin = (iterator)&local_8e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_8f0,
             msg_06);
  local_698._M_dataplus._M_p._0_1_ = 0;
  local_698._M_string_length = 0;
  local_698.field_2._M_allocated_capacity = 0;
  local_678[8] = false;
  local_678._0_8_ = &PTR__lazy_ostream_0113a848;
  local_668 = boost::unit_test::lazy_ostream::inst;
  local_660 = "exception std::runtime_error expected but not raised";
  local_900 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_parse_tests.cpp"
  ;
  local_8f8 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_698,(lazy_ostream *)local_678,1,1,WARN,(check_type)psVar7,
             (size_t)&local_900,0x35);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_698.field_2._M_allocated_capacity);
  std::__cxx11::string::~string((string *)&all_out);
  std::__cxx11::string::~string((string *)&all_in);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&IN_OUT);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(parse_script)
{
    const std::vector<std::pair<std::string,std::string>> IN_OUT{
        // {IN: script string , OUT: hex string }
        {"", ""},
        {"0", "00"},
        {"1", "51"},
        {"2", "52"},
        {"3", "53"},
        {"4", "54"},
        {"5", "55"},
        {"6", "56"},
        {"7", "57"},
        {"8", "58"},
        {"9", "59"},
        {"10", "5a"},
        {"11", "5b"},
        {"12", "5c"},
        {"13", "5d"},
        {"14", "5e"},
        {"15", "5f"},
        {"16", "60"},
        {"17", "0111"},
        {"-9", "0189"},
        {"0x17", "17"},
        {"'17'", "023137"},
        {"ELSE", "67"},
        {"NOP10", "b9"},
    };
    std::string all_in;
    std::string all_out;
    for (const auto& [in, out] : IN_OUT) {
        BOOST_CHECK_EQUAL(HexStr(ParseScript(in)), out);
        all_in += " " + in + " ";
        all_out += out;
    }
    BOOST_CHECK_EQUAL(HexStr(ParseScript(all_in)), all_out);

    BOOST_CHECK_EXCEPTION(ParseScript("11111111111111111111"), std::runtime_error, HasReason("script parse error: decimal numeric value only allowed in the range -0xFFFFFFFF...0xFFFFFFFF"));
    BOOST_CHECK_EXCEPTION(ParseScript("11111111111"), std::runtime_error, HasReason("script parse error: decimal numeric value only allowed in the range -0xFFFFFFFF...0xFFFFFFFF"));
    BOOST_CHECK_EXCEPTION(ParseScript("OP_CHECKSIGADD"), std::runtime_error, HasReason("script parse error: unknown opcode"));
}